

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O2

pvip_t * pvip_new(void)

{
  pvip_t *ppVar1;
  pvip_arena *ppVar2;
  
  ppVar1 = (pvip_t *)malloc(8);
  if (ppVar1 != (pvip_t *)0x0) {
    ppVar2 = (pvip_arena *)calloc(1,0x6010);
    ppVar1->arena = ppVar2;
    return ppVar1;
  }
  fwrite("[PVIP] Cannot allocate memory",0x1d,1,_stderr);
  abort();
}

Assistant:

struct pvip_t* pvip_new() {
    pvip_t* pvip = malloc(sizeof(pvip_t));
    ALLOC_CHECK(pvip);
    pvip->arena = malloc(sizeof(struct pvip_arena));
    memset(pvip->arena, 0, sizeof(struct pvip_arena));
    return pvip;
}